

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall
String::token(String *__return_storage_ptr__,String *this,char separator,usize *start)

{
  char *pcVar1;
  char *pcVar2;
  usize uVar3;
  String *result;
  
  pcVar1 = find(this,separator,*start);
  if (pcVar1 == (char *)0x0) {
    substr(__return_storage_ptr__,this,*start,-1);
    uVar3 = this->data->len;
  }
  else {
    pcVar2 = operator_cast_to_char_(this);
    uVar3 = *start;
    substr(__return_storage_ptr__,this,uVar3,(long)pcVar1 - (long)(pcVar2 + uVar3));
    uVar3 = *start + ((long)pcVar1 - (long)(pcVar2 + uVar3)) + 1;
  }
  *start = uVar3;
  return __return_storage_ptr__;
}

Assistant:

String String::token(char separator, usize& start) const
{
  const char* endStr = find(separator, start);
  if(endStr)
  {
    usize len = endStr - (*this + start);
    String result = String::substr(start, len);
    start += len + 1;
    return result;
  }
  String result = substr(start);
  start = data->len;
  return result;
}